

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall lunasvg::SVGNumberPercentage::parse(SVGNumberPercentage *this,string_view input)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  byte *pbVar4;
  long lVar5;
  float fVar6;
  float value;
  float local_1c;
  string_view local_18;
  
  pbVar4 = (byte *)input._M_str;
  local_18._M_len = input._M_len;
  local_1c = 0.0;
  local_18._M_str = (char *)pbVar4;
  if (local_18._M_len != 0) {
    pbVar1 = pbVar4 + local_18._M_len;
    lVar3 = -local_18._M_len;
    do {
      if ((0x20 < (ulong)(byte)*local_18._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_18._M_str & 0x3f) & 1) == 0)) {
        lVar5 = 0;
        goto LAB_0011f8b9;
      }
      local_18._M_str = (char *)((byte *)local_18._M_str + 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    local_18._M_len = 0;
    local_18._M_str = (char *)pbVar1;
  }
  goto LAB_0011f8e2;
  while (bVar2 = lVar3 + 1 != lVar5, lVar5 = lVar5 + -1, bVar2) {
LAB_0011f8b9:
    if ((0x20 < (ulong)pbVar4[lVar5 + (local_18._M_len - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar4[lVar5 + (local_18._M_len - 1)] & 0x3f) & 1) == 0)) {
      local_18._M_len = lVar5 - lVar3;
      goto LAB_0011f8e2;
    }
  }
  local_18._M_len = 0;
LAB_0011f8e2:
  bVar2 = parseNumber<float>(&local_18,&local_1c);
  if ((bVar2) &&
     ((local_18._M_len == 0 ||
      ((*local_18._M_str == 0x25 && (local_1c = local_1c / 100.0, local_18._M_len == 1)))))) {
    fVar6 = 1.0;
    if (local_1c <= 1.0) {
      fVar6 = local_1c;
    }
    *(uint *)&(this->super_SVGProperty).field_0xc = ~-(uint)(local_1c < 0.0) & (uint)fVar6;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SVGNumberPercentage::parse(std::string_view input)
{
    float value = 0.f;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value))
        return false;
    if(!input.empty() && input.front() == '%') {
        value /= 100.f;
        input.remove_prefix(1);
    }

    if(!input.empty())
        return false;
    m_value = std::clamp(value, 0.f, 1.f);
    return true;
}